

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O1

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,UnicodeString *pattern,uint32_t options,SymbolTable *symbols,
          UErrorCode *status)

{
  short sVar1;
  int iVar2;
  int32_t i;
  ParsePosition pos;
  int local_34;
  ParsePosition local_30;
  
  local_30.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b8398;
  local_30.index = 0;
  local_30.errorIndex = -1;
  applyPattern(this,pattern,&local_30,options,symbols,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_34 = local_30.index;
    if ((options & 1) != 0) {
      ICU_Utility::skipWhitespace(pattern,&local_34,'\x01');
    }
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (local_34 != iVar2) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  ParsePosition::~ParsePosition(&local_30);
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                                     uint32_t options,
                                     const SymbolTable* symbols,
                                     UErrorCode& status) {
    ParsePosition pos(0);
    applyPattern(pattern, pos, options, symbols, status);
    if (U_FAILURE(status)) return *this;

    int32_t i = pos.getIndex();

    if (options & USET_IGNORE_SPACE) {
        // Skip over trailing whitespace
        ICU_Utility::skipWhitespace(pattern, i, TRUE);
    }

    if (i != pattern.length()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}